

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.h
# Opt level: O1

void __thiscall QHttpNetworkConnectionChannel::pipelineFlush(QHttpNetworkConnectionChannel *this)

{
  if (*(long *)(this + 0xe0) != 0) {
    QIODevice::write(*(QByteArray **)(this + 0x10));
    QByteArray::clear();
    return;
  }
  return;
}

Assistant:

constexpr bool isEmpty() const noexcept { return size() == 0; }